

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O2

void NodeDump(nodecontext *p,textwriter_conflict *Text)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = (p->NodeSingleton)._Begin;
  for (pcVar2 = pcVar1; pcVar2 != pcVar1 + ((p->NodeSingleton)._Used & 0xfffffffffffffff8);
      pcVar2 = pcVar2 + 8) {
    if (*(node **)pcVar2 != (node *)0x0) {
      NodeDumpObject(*(node **)pcVar2,Text);
      pcVar1 = (p->NodeSingleton)._Begin;
    }
  }
  return;
}

Assistant:

void NodeDump(nodecontext* p,textwriter* Text)
{
    //no NodeLock, because may be stayed locked when dumping after crash
    node **i;
    for (i=ARRAYBEGIN(p->NodeSingleton,node*);i!=ARRAYEND(p->NodeSingleton,node*);++i)
        if (*i)
            NodeDumpObject(*i,Text);
}